

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bet.cpp
# Opt level: O2

uint __thiscall Bet::selectBetKeno(Bet *this,uint *bet,double *credit)

{
  double *credits;
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  CreditField repeatInput;
  vector<unsigned_int,_std::allocator<unsigned_int>_> betVector;
  string y;
  uint FiveEuro;
  uint FourEuro;
  uint threeEuro;
  uint twoEuro;
  uint oneEuro;
  SelectGame selectgame;
  string confirm;
  string okay;
  
  betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  oneEuro = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&oneEuro);
  twoEuro = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&twoEuro);
  threeEuro = 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&threeEuro);
  FourEuro = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&FourEuro);
  FiveEuro = 5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&FiveEuro);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&okay,"ok",(allocator<char> *)&selectgame);
  confirm._M_dataplus._M_p = (pointer)&confirm.field_2;
  confirm._M_string_length = 0;
  confirm.field_2._M_local_buf[0] = '\0';
  y._M_dataplus._M_p = (pointer)&y.field_2;
  y._M_string_length = 0;
  y.field_2._M_local_buf[0] = '\0';
  CreditField::CreditField(&repeatInput);
  credits = &this->_credit_bet;
  while (*credits <= 1.0 && *credits != 1.0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Please insert Credit! The minimum is 1 Euro! ");
    std::endl<char,std::char_traits<char>>(poVar4);
    CreditField::AddCredit(&repeatInput,credits);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,">>>The minimum bet is: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," Euro and the max bet is: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," Euro! ");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,">>>Current Bet: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," Euro");
  std::endl<char,std::char_traits<char>>(poVar4);
  if (1.0 <= *credits) {
    poVar4 = std::operator<<((ostream *)&std::cout,">>>Please, Select Bet! ");
    std::endl<char,std::char_traits<char>>(poVar4);
    dVar9 = *credits;
    if (5.0 <= dVar9) {
      poVar4 = std::operator<<((ostream *)&std::cout,">>>Play On Max Bet!");
      std::endl<char,std::char_traits<char>>(poVar4);
      dVar9 = *credits;
    }
    if (dVar9 < 5.0) {
      poVar4 = std::operator<<((ostream *)&std::cout,">>>Insert credit to play on max bet! ");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = 0;
    iVar7 = 0;
LAB_00102a21:
    bVar1 = std::operator!=(&confirm,&okay);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"---Press y to increase the bet! ");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"---Press n to decrease the bet!");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"---Press q to quit!");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"---Press o to play with current bet!");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"---Press m for more games!");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "********************************************************************************************************************"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      std::operator>>((istream *)&std::cin,(string *)&y);
      for (uVar8 = 0;
          uVar8 < (ulong)((long)betVector.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)betVector.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2); uVar8 = uVar8 + 1) {
        cVar5 = *y._M_dataplus._M_p;
        if (cVar5 == 'm') {
          cVar5 = 'm';
          if (y._M_string_length == 1) {
            SelectGame::SelectGame(&selectgame);
            SelectGame::selectGame_Welcome(&selectgame);
            SelectGame::selectGame_Games(&selectgame);
            SelectGame::selectGame_Option(&selectgame,credit);
            SelectGame::~SelectGame(&selectgame);
            cVar5 = *y._M_dataplus._M_p;
          }
        }
        else if (cVar5 == 'n') {
          cVar5 = 'n';
          if (y._M_string_length == 1) {
            if (betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] < 2) {
              betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] = 1;
              *bet = 1;
              iVar2 = iVar7 + 1;
              if (-1 < iVar7) {
                poVar4 = std::operator<<((ostream *)&std::cout,
                                         "You are already playing on minimum bet!");
                std::endl<char,std::char_traits<char>>(poVar4);
              }
            }
            else {
              uVar6 = betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar8] - 1;
              betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] = uVar6;
              *bet = uVar6;
              iVar2 = 0;
            }
            poVar4 = std::operator<<((ostream *)&std::cout,"Your Current bet is: ");
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4," Euro");
            std::endl<char,std::char_traits<char>>(poVar4);
            iVar7 = iVar2;
            break;
          }
        }
        else if (cVar5 == 'q') {
          cVar5 = 'q';
          if (y._M_string_length == 1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Cashout...");
            std::endl<char,std::char_traits<char>>(poVar4);
            std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
            poVar4 = std::ostream::_M_insert<double>(*credits);
            poVar4 = std::operator<<(poVar4," Euro!");
            std::endl<char,std::char_traits<char>>(poVar4);
            SelectGame::SelectGame(&selectgame);
            SelectGame::selectGame_Welcome(&selectgame);
            SelectGame::selectGame_Games(&selectgame);
            *credit = 0.0;
            SelectGame::selectGame_Option(&selectgame,credit);
            SelectGame::~SelectGame(&selectgame);
            break;
          }
        }
        else if ((cVar5 == 'y') && (cVar5 = 'y', y._M_string_length == 1)) {
          dVar9 = *credits;
          if ((double)*bet < dVar9) {
            if (betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] < 5) {
              if ((*credit == 1.0) && (!NAN(*credit))) {
                *bet = 1;
              }
              uVar6 = 1;
              if ((dVar9 != 1.0) || (NAN(dVar9))) {
                uVar6 = betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar8] + 1;
                betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] = uVar6;
              }
              *bet = uVar6;
              iVar7 = 0;
            }
            else {
              betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] = 5;
              *bet = 5;
              iVar3 = iVar3 + 1;
            }
            if (0 < iVar3) {
              poVar4 = std::operator<<((ostream *)&std::cout,"You are already playing on max bet!");
              std::endl<char,std::char_traits<char>>(poVar4);
            }
            poVar4 = std::operator<<((ostream *)&std::cout,"Your Current bet is: ");
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4," Euro");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          else {
            if (((*bet != 5) || (*credit != 5.0)) || (NAN(*credit))) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "Not enough credits to increase the bet!");
              std::endl<char,std::char_traits<char>>(poVar4);
              std::operator<<((ostream *)&std::cout,"Credits: ");
              poVar4 = std::ostream::_M_insert<double>(*credits);
              std::endl<char,std::char_traits<char>>(poVar4);
              poVar4 = std::operator<<((ostream *)&std::cout,"Bet: ");
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,"You are already playing on max bet!");
              std::endl<char,std::char_traits<char>>(poVar4);
              poVar4 = std::operator<<((ostream *)&std::cout,"Your Current bet is: ");
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              poVar4 = std::operator<<(poVar4," Euro");
            }
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          break;
        }
        if ((cVar5 == 'o') && (y._M_string_length == 1)) {
          iVar2 = system("CLS");
          if (iVar2 != 0) {
            system("clear");
          }
          *bet = betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
          Start::Start((Start *)&selectgame);
          Start::StartGameNowKeno((Start *)&selectgame,credits,bet);
          std::__cxx11::string::assign((char *)&confirm);
          Start::~Start((Start *)&selectgame);
          break;
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"Invalid Input");
        std::endl<char,std::char_traits<char>>(poVar4);
        *bet = 1;
        std::operator>>((istream *)&std::cin,(string *)&y);
      }
      goto LAB_00102a21;
    }
  }
  uVar6 = *bet;
  CreditField::~CreditField(&repeatInput);
  std::__cxx11::string::~string((string *)&y);
  std::__cxx11::string::~string((string *)&confirm);
  std::__cxx11::string::~string((string *)&okay);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return uVar6;
}

Assistant:

unsigned int Bet::selectBetKeno(unsigned int& bet, double& credit) {

	std::vector<unsigned int> betVector;
	unsigned const int oneEuro = 1;
	betVector.push_back(oneEuro);
	unsigned const int twoEuro = 2;
	betVector.push_back(twoEuro);
	unsigned const int threeEuro = 3;
	betVector.push_back(threeEuro);
	unsigned const int FourEuro = 4;
	betVector.push_back(FourEuro);
	unsigned const int FiveEuro = 5;
	betVector.push_back(FiveEuro);

	std::string okay = "ok";
	std::string confirm;
	std::string y;
	int countAbove = 0;
	int countBelow = 0;

	//if credit < 1
	//if credit < 5
	//if credit< cannot increase!
	CreditField repeatInput;

	while (_credit_bet < oneEuro) {

		std::cout << "Please insert Credit! The minimum is 1 Euro! " << std::endl;
		repeatInput.AddCredit(_credit_bet);

	}
	std::cout << ">>>The minimum bet is: " << oneEuro << " Euro and the max bet is: " << FiveEuro << " Euro! " << std::endl;
	std::cout << ">>>Current Bet: " << betVector[0] << " Euro" << std::endl;
	if (_credit_bet >= oneEuro) {
		std::cout << ">>>Please, Select Bet! " << std::endl;
		if (_credit_bet >= FiveEuro) {
			std::cout << ">>>Play On Max Bet!" << std::endl;
		}
		if (_credit_bet < FiveEuro) {
			std::cout << ">>>Insert credit to play on max bet! " << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		while (confirm != okay) {
			std::cout << "---Press y to increase the bet! " << std::endl;
			std::cout << "---Press n to decrease the bet!" << std::endl;
			std::cout << "---Press q to quit!" << std::endl;
			std::cout << "---Press o to play with current bet!" << std::endl;
			std::cout << "---Press m for more games!" << std::endl;
			std::cout << "********************************************************************************************************************" << std::endl;
			std::cin >> y;
			//new code here for safety
			/*while (y.size() > 1) {

				std::cin >> y;
			}*/
			for (int i = 0; i < betVector.size(); i++) {
				if (y[0] == 'y' && y.size() == 1) {
					if (_credit_bet <= bet) {
						if (credit == FiveEuro && bet == FiveEuro) {
							std::cout << "You are already playing on max bet!" << std::endl;
							std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
							break;
						}
						else {
							std::cout << "Not enough credits to increase the bet!" << std::endl;
							std::cout << "Credits: " << _credit_bet << std::endl;
							std::cout << "Bet: " << bet << std::endl;

							break;
						}

					}
					else {

						if (betVector[i] >= FiveEuro) {
							betVector[i] = FiveEuro;
							bet = betVector[i];
							countAbove++;
						}
						else {
							if (credit == oneEuro) {
								bet = oneEuro;
							}
							if (_credit_bet == oneEuro) {
								bet = oneEuro;
							}
							else {

								betVector[i] += oneEuro;
								bet = betVector[i];
							}

							countBelow = 0;
						}
						if (countAbove > 0) {
							std::cout << "You are already playing on max bet!" << std::endl;
						}
						std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
						break;
					}

				}
				if (y[0] == 'n' && y.size() == 1) {

					if (betVector[i] <= oneEuro) {
						betVector[i] = oneEuro;
						bet = betVector[i];
						countBelow++;
					}
					else {
						betVector[i] -= 1;
						bet = betVector[i];
						countBelow = 0;
					}
					if (countBelow > 0) {
						std::cout << "You are already playing on minimum bet!" << std::endl;
					}
					std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
					break;
				}
				if (y[0] == 'q' && y.size() == 1) {
					std::cout << "Cashout..." << std::endl;
					std::cout << "Handpay! Call Attendant! " << _credit_bet << " Euro!" << std::endl;
					//std::chrono::seconds duration(3);
					//std::this_thread::sleep_for(duration);
					SelectGame selectgame;
					selectgame.selectGame_Welcome();
					selectgame.selectGame_Games();
					credit = 0;
					//choosing a game
					selectgame.selectGame_Option(credit);

					//exit(0);
					break;
				}
				if (y[0] == 'm' && y.size() == 1) {
					SelectGame selectgame;
					selectgame.selectGame_Welcome();
					selectgame.selectGame_Games();

					//choosing a game
					selectgame.selectGame_Option(credit);
				}

				if (y[0] == 'o' && y.size() == 1) {
					if (system("CLS")) system("clear");
					bet = betVector[i];
					Start startgame;
					startgame.StartGameNowKeno(_credit_bet, bet);
					confirm = "ok";
					break;
				}
				else {
					std::cout << "Invalid Input" << std::endl;
					bet = oneEuro;
					std::cin >> y;
				}
			}
		}
	}
	return bet;
}